

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

DecodePsbtInputStruct * __thiscall
cfd::api::json::DecodePsbtInput::ConvertToStruct(DecodePsbtInput *this)

{
  long in_RSI;
  DecodePsbtInputStruct *in_RDI;
  DecodePsbtInputStruct *result;
  DecodePsbtUtxoStruct *in_stack_fffffffffffffbe8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  DecodePsbtUtxoStruct *in_stack_fffffffffffffbf0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *in_stack_fffffffffffffbf8;
  vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *__x;
  vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>
  *in_stack_fffffffffffffc00;
  vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *this_01;
  PsbtScriptData *this_02;
  DecodePsbtInputStruct *in_stack_fffffffffffffc50;
  DecodeRawTransactionResponse *in_stack_fffffffffffffc58;
  undefined1 local_3a0 [72];
  JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct> *in_stack_fffffffffffffca8;
  DecodePsbtUtxo *in_stack_fffffffffffffcc8;
  pointer in_stack_fffffffffffffce8;
  PsbtScriptData local_1e0 [3];
  undefined1 local_11;
  
  local_11 = 0;
  DecodePsbtInputStruct::DecodePsbtInputStruct(in_stack_fffffffffffffc50);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)(in_RSI + 0x38));
  DecodeRawTransactionResponse::ConvertToStruct(in_stack_fffffffffffffc58);
  DecodeRawTransactionResponseStruct::operator=
            ((DecodeRawTransactionResponseStruct *)in_stack_fffffffffffffbf0,
             (DecodeRawTransactionResponseStruct *)in_stack_fffffffffffffbe8);
  DecodeRawTransactionResponseStruct::~DecodeRawTransactionResponseStruct
            ((DecodeRawTransactionResponseStruct *)in_stack_fffffffffffffbf0);
  DecodePsbtUtxo::ConvertToStruct(in_stack_fffffffffffffcc8);
  DecodePsbtUtxoStruct::operator=(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  DecodePsbtUtxoStruct::~DecodePsbtUtxoStruct(in_stack_fffffffffffffbf0);
  core::JsonObjectVector<cfd::api::json::PsbtSignatureData,_PsbtSignatureDataStruct>::
  ConvertToStruct((JsonObjectVector<cfd::api::json::PsbtSignatureData,_PsbtSignatureDataStruct> *)
                  in_stack_fffffffffffffca8);
  this_02 = local_1e0;
  std::vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>::operator=
            (in_stack_fffffffffffffc00,
             (vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_> *)
             in_stack_fffffffffffffbf8);
  std::vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>::~vector
            (in_stack_fffffffffffffc00);
  std::__cxx11::string::operator=((string *)&in_RDI->sighash,(string *)(in_RSI + 0x240));
  PsbtScriptData::ConvertToStruct(this_02);
  PsbtScriptDataStruct::operator=
            ((PsbtScriptDataStruct *)in_stack_fffffffffffffbf0,
             (PsbtScriptDataStruct *)in_stack_fffffffffffffbe8);
  PsbtScriptDataStruct::~PsbtScriptDataStruct((PsbtScriptDataStruct *)in_stack_fffffffffffffbf0);
  PsbtScriptData::ConvertToStruct(this_02);
  PsbtScriptDataStruct::operator=
            ((PsbtScriptDataStruct *)in_stack_fffffffffffffbf0,
             (PsbtScriptDataStruct *)in_stack_fffffffffffffbe8);
  PsbtScriptDataStruct::~PsbtScriptDataStruct((PsbtScriptDataStruct *)in_stack_fffffffffffffbf0);
  core::JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct>::ConvertToStruct
            ((JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct> *)
             in_stack_fffffffffffffce8);
  this_01 = (vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *)
            &stack0xfffffffffffffce8;
  std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>::operator=
            (this_01,in_stack_fffffffffffffbf8);
  std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>::~vector(this_01);
  DecodeUnlockingScript::ConvertToStruct((DecodeUnlockingScript *)this_02);
  __x = (vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)(local_3a0 + 0x18);
  DecodeUnlockingScriptStruct::operator=
            ((DecodeUnlockingScriptStruct *)in_stack_fffffffffffffbf0,
             (DecodeUnlockingScriptStruct *)in_stack_fffffffffffffbe8);
  DecodeUnlockingScriptStruct::~DecodeUnlockingScriptStruct
            ((DecodeUnlockingScriptStruct *)in_stack_fffffffffffffbf0);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertToStruct((JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffc58);
  this_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_01,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)__x);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
  core::JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct>::ConvertToStruct
            (in_stack_fffffffffffffca8);
  psVar1 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&stack0xfffffffffffffc48;
  std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::operator=
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)this_01,__x);
  std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::~vector
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)this_01);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(this_00,psVar1);
  return in_RDI;
}

Assistant:

DecodePsbtInputStruct DecodePsbtInput::ConvertToStruct() const {  // NOLINT
  DecodePsbtInputStruct result;
  result.non_witness_utxo_hex = non_witness_utxo_hex_;
  result.non_witness_utxo = non_witness_utxo_.ConvertToStruct();
  result.witness_utxo = witness_utxo_.ConvertToStruct();
  result.partial_signatures = partial_signatures_.ConvertToStruct();
  result.sighash = sighash_;
  result.redeem_script = redeem_script_.ConvertToStruct();
  result.witness_script = witness_script_.ConvertToStruct();
  result.bip32_derivs = bip32_derivs_.ConvertToStruct();
  result.final_scriptsig = final_scriptsig_.ConvertToStruct();
  result.final_scriptwitness = final_scriptwitness_.ConvertToStruct();
  result.unknown = unknown_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}